

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopUtil.c
# Opt level: O1

void Hop_ObjCollectMulti_rec(Hop_Obj_t *pRoot,Hop_Obj_t *pObj,Vec_Ptr_t *vSuper)

{
  uint uVar1;
  uint uVar2;
  void **ppvVar3;
  long lVar4;
  int iVar5;
  
  for (; (pRoot == pObj ||
         (((((ulong)pObj & 1) == 0 && (uVar2 = *(uint *)&pObj->field_0x20 & 7, uVar2 != 2)) &&
          ((*(uint *)&pRoot->field_0x20 & 7) == uVar2)))); pObj = pObj->pFanin1) {
    Hop_ObjCollectMulti_rec(pRoot,pObj->pFanin0,vSuper);
  }
  uVar2 = vSuper->nSize;
  if (0 < (long)(int)uVar2) {
    lVar4 = 0;
    do {
      if ((Hop_Obj_t *)vSuper->pArray[lVar4] == pObj) {
        return;
      }
      lVar4 = lVar4 + 1;
    } while ((int)uVar2 != lVar4);
  }
  uVar1 = vSuper->nCap;
  if (uVar2 == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vSuper->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
      }
      else {
        ppvVar3 = (void **)realloc(vSuper->pArray,0x80);
      }
      vSuper->pArray = ppvVar3;
      iVar5 = 0x10;
    }
    else {
      iVar5 = uVar1 * 2;
      if (iVar5 <= (int)uVar1) goto LAB_007e5260;
      if (vSuper->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar3 = (void **)realloc(vSuper->pArray,(ulong)uVar1 << 4);
      }
      vSuper->pArray = ppvVar3;
    }
    vSuper->nCap = iVar5;
  }
LAB_007e5260:
  iVar5 = vSuper->nSize;
  vSuper->nSize = iVar5 + 1;
  vSuper->pArray[iVar5] = pObj;
  return;
}

Assistant:

void Hop_ObjCollectMulti_rec( Hop_Obj_t * pRoot, Hop_Obj_t * pObj, Vec_Ptr_t * vSuper )
{
    if ( pRoot != pObj && (Hop_IsComplement(pObj) || Hop_ObjIsPi(pObj) || Hop_ObjType(pRoot) != Hop_ObjType(pObj)) )
    {
        Vec_PtrPushUnique(vSuper, pObj);
        return;
    }
    Hop_ObjCollectMulti_rec( pRoot, Hop_ObjChild0(pObj), vSuper );
    Hop_ObjCollectMulti_rec( pRoot, Hop_ObjChild1(pObj), vSuper );
}